

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O3

void anurbs::Box<2l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *this;
  string name;
  class_<anurbs::Box<2L>,_std::shared_ptr<anurbs::Box<2L>_>_> local_80;
  long *local_78;
  long local_68 [2];
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  arg local_38;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::Box<2L>,_std::shared_ptr<anurbs::Box<2L>_>_>::class_<>
            (&local_80,(m->super_object).super_handle.m_ptr,(char *)local_78);
  local_28.name = "a";
  local_28._8_1_ = 2;
  local_38.name = "b";
  local_38._8_1_ = 2;
  pybind11::class_<anurbs::Box<2L>,_std::shared_ptr<anurbs::Box<2L>_>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg>
            (&local_80,"__init__",(type *)&local_48,(is_new_style_constructor *)&local_58,&local_28,
             &local_38);
  local_48 = Box<2L>::min;
  local_40 = 0;
  this = (class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *)
         pybind11::class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>>::
         def_property_readonly<Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>(anurbs::Box<2l>::*)()>
                   ((class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>> *)&local_80,"min",
                    (offset_in_Model_to_subr *)&local_48);
  local_58 = Box<2L>::max;
  local_50 = 0;
  pybind11::class_<anurbs::Box<2l>,std::shared_ptr<anurbs::Box<2l>>>::
  def_property_readonly<Eigen::Ref<Eigen::Matrix<double,1,2,1,1,2>,0,Eigen::InnerStride<1>>(anurbs::Box<2l>::*)()>
            (this,"max",(offset_in_Model_to_subr *)&local_58);
  pybind11::object::~object((object *)&local_80);
  Model::register_python_data_type<anurbs::Box<2l>>(m,model);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<Vector, Vector>(), "a"_a, "b"_a)
            // read-only properties
            .def_property_readonly("min", py::overload_cast<>(&Type::min))
            .def_property_readonly("max", py::overload_cast<>(&Type::max))
        ;

        Model::register_python_data_type<Type>(m, model);
    }